

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalDefinition.cpp
# Opt level: O3

string * __thiscall
license::locate::ExternalDefinition::retrieve_license_content
          (string *__return_storage_ptr__,ExternalDefinition *this,string *licenseLocation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *szptr;
  size_t __n;
  LicenseLocation *pLVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  allocator local_69;
  string local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (**(this->super_LocatorStrategy)._vptr_LocatorStrategy)(&local_68);
  __n = licenseLocation->_M_string_length;
  if (__n == local_68._M_string_length) {
    if (__n == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp((licenseLocation->_M_dataplus)._M_p,local_68._M_dataplus._M_p,__n);
      bVar5 = iVar3 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar5) {
    pLVar2 = this->m_location;
    szptr = pLVar2->licenseData;
    sVar4 = mstrnlen_s(szptr,0x1000);
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,szptr,pLVar2->licenseData + sVar4);
    if (this->m_location->license_data_type == LICENSE_ENCODED) {
      unbase64(&local_48,&local_68);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (char *)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_69);
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_68.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_68.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_68._M_string_length;
    }
  }
  else {
    LocatorStrategy::retrieve_license_content
              (__return_storage_ptr__,&this->super_LocatorStrategy,licenseLocation);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ExternalDefinition::retrieve_license_content(const std::string &licenseLocation) const {
	if (licenseLocation == get_strategy_name()) {
		string licData(m_location->licenseData, mstrnlen_s(m_location->licenseData, LCC_API_MAX_LICENSE_DATA_LENGTH));
		if (m_location->license_data_type == LICENSE_ENCODED) {
			// FIXME what if license content is not base64
			vector<uint8_t> raw = unbase64(licData);
			string str = string(reinterpret_cast<char *>(raw.data()));
			return str;
		} else {
			return licData;
		}
	} else {
		return LocatorStrategy::retrieve_license_content(licenseLocation);
	}
}